

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testInvalidModelUnsupportedLayersForBP(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *pFVar2;
  FeatureType *pFVar3;
  ArrayFeatureType *pAVar4;
  NeuralNetwork *this;
  NeuralNetworkLayer *pNVar5;
  InnerProductLayerParams *this_00;
  WeightParams *pWVar6;
  UnaryFunctionLayerParams *this_01;
  PoolingLayerParams *this_02;
  NetworkUpdateParameters *this_03;
  LossLayer *this_04;
  ostream *poVar7;
  undefined1 local_e8 [8];
  Result res;
  CategoricalCrossEntropyLossLayer *ceLossLayer;
  LossLayer *lossLayer;
  NetworkUpdateParameters *updateParams;
  PoolingLayerParams *params;
  NeuralNetworkLayer *l3;
  UnaryFunctionLayerParams *elem;
  NeuralNetworkLayer *l2;
  InnerProductLayerParams *innerProductParams;
  NeuralNetworkLayer *l1;
  NeuralNetwork *nn;
  ArrayFeatureType *type_out;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar2 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"A");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  pAVar4 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar4,ArrayFeatureType_ArrayDataType_FLOAT32);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,1);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,1);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,1);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar2 = CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"B");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  pAVar4 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar4,ArrayFeatureType_ArrayDataType_FLOAT32);
  CoreML::Specification::Model::set_isupdatable((Model *)&topIn,true);
  CoreML::Specification::Model::set_specificationversion((Model *)&topIn,4);
  this = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  pNVar5 = CoreML::Specification::NeuralNetwork::add_layers(this);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar5,"inner_layer");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar5,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar5,"ip");
  CoreML::Specification::NeuralNetworkLayer::set_isupdatable(pNVar5,true);
  this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(pNVar5);
  CoreML::Specification::InnerProductLayerParams::set_inputchannels(this_00,1);
  CoreML::Specification::InnerProductLayerParams::set_outputchannels(this_00,1);
  pWVar6 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this_00);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar6,1.0);
  pWVar6 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this_00);
  CoreML::Specification::WeightParams::set_isupdatable(pWVar6,true);
  CoreML::Specification::InnerProductLayerParams::set_hasbias(this_00,true);
  pWVar6 = CoreML::Specification::InnerProductLayerParams::mutable_bias(this_00);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar6,1.0);
  pWVar6 = CoreML::Specification::InnerProductLayerParams::mutable_bias(this_00);
  CoreML::Specification::WeightParams::set_isupdatable(pWVar6,true);
  pNVar5 = CoreML::Specification::NeuralNetwork::add_layers(this);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar5,"abs_layer");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar5,"ip");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar5,"abs_out");
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_unary(pNVar5);
  CoreML::Specification::UnaryFunctionLayerParams::set_type
            (this_01,UnaryFunctionLayerParams_Operation_ABS);
  pNVar5 = CoreML::Specification::NeuralNetwork::add_layers(this);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar5,"pooling_layer");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar5,"abs_out");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar5,"B");
  this_02 = CoreML::Specification::NeuralNetworkLayer::mutable_pooling(pNVar5);
  CoreML::Specification::PoolingLayerParams::set_type
            (this_02,PoolingLayerParams_PoolingType_AVERAGE);
  CoreML::Specification::PoolingLayerParams::set_globalpooling(this_02,true);
  CoreML::Specification::PoolingLayerParams::mutable_valid(this_02);
  this_03 = CoreML::Specification::NeuralNetwork::mutable_updateparams(this);
  this_04 = CoreML::Specification::NetworkUpdateParameters::add_losslayers(this_03);
  CoreML::Specification::LossLayer::set_name(this_04,"loss_layer");
  res.m_message.field_2._8_8_ =
       CoreML::Specification::LossLayer::mutable_categoricalcrossentropylosslayer(this_04);
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_input
            ((CategoricalCrossEntropyLossLayer *)res.m_message.field_2._8_8_,"B");
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_target
            ((CategoricalCrossEntropyLossLayer *)res.m_message.field_2._8_8_,"label_target");
  CoreML::Model::validate((Result *)local_e8,(Model *)&topIn);
  m._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_e8);
  if (m._oneof_case_[0]._0_1_) {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x168);
    poVar7 = std::operator<<(poVar7,": error: ");
    poVar7 = std::operator<<(poVar7,"!((res).good())");
    poVar7 = std::operator<<(poVar7," was false, expected true.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_e8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidModelUnsupportedLayersForBP() {

    /* checks if there are layers between updatable-marked layers and loss function that do not support back-propagation
     input ---> inner_product (U) ----> ABS (not supported for BP) ---> pooling --> output
     */


    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    shape->add_shape(1);
    shape->add_shape(1);
    shape->add_shape(1);

    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    auto *type_out = out->mutable_type()->mutable_multiarraytype();
    type_out->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    m.set_isupdatable(true);
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    auto *nn = m.mutable_neuralnetwork();
    auto *l1 = nn->add_layers();
    l1->set_name("inner_layer");
    l1->add_input("A");
    l1->add_output("ip");
    l1->set_isupdatable(true);
    Specification::InnerProductLayerParams *innerProductParams = l1->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);
    innerProductParams->mutable_weights()->add_floatvalue(1.0);
    innerProductParams->mutable_weights()->set_isupdatable(true);
    innerProductParams->set_hasbias(true);
    innerProductParams->mutable_bias()->add_floatvalue(1.0);
    innerProductParams->mutable_bias()->set_isupdatable(true);

    auto *l2 = nn->add_layers();
    l2->set_name("abs_layer");
    l2->add_input("ip");
    l2->add_output("abs_out");
    auto *elem = l2->mutable_unary();
    elem->set_type(Specification::UnaryFunctionLayerParams::ABS);

    auto *l3 = nn->add_layers();
    l3->set_name("pooling_layer");
    l3->add_input("abs_out");
    l3->add_output("B");
    auto *params = l3->mutable_pooling();
    params->set_type(::Specification::PoolingLayerParams::AVERAGE);
    params->set_globalpooling(true);
    params->mutable_valid();

    Specification::NetworkUpdateParameters *updateParams = nn->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name("loss_layer");

    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input("B");
    ceLossLayer->set_target("label_target");

    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);
    return 0;
}